

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::PrepareForIndexedDraw
          (DeviceContextVkImpl *this,DRAW_FLAGS Flags,VALUE_TYPE IndexType)

{
  Uint64 UVar1;
  VkIndexType VVar2;
  VkBuffer pVVar3;
  size_t sVar4;
  char *in_RCX;
  VkDeviceSize VVar5;
  string msg;
  string local_50;
  
  PrepareForDraw(this,Flags);
  if ((Flags & DRAW_FLAG_VERIFY_STATES) != DRAW_FLAG_NONE) {
    in_RCX = "Indexed draw call (DeviceContextVkImpl::Draw)";
    DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyBufferState
              ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,
               (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pIndexBuffer.m_pObject,
               RESOURCE_STATE_INDEX_BUFFER,"Indexed draw call (DeviceContextVkImpl::Draw)");
  }
  if (1 < (byte)(IndexType - VT_UINT16)) {
    FormatString<char[66]>
              (&local_50,
               (char (*) [66])"Unsupported index format. Only R16_UINT and R32_UINT are allowed.");
    in_RCX = (char *)0x332;
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"PrepareForIndexedDraw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x332);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  VVar2 = TypeToVkIndexType(IndexType);
  pVVar3 = BufferVkImpl::GetVkBuffer
                     ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pIndexBuffer.m_pObject
                     );
  UVar1 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_IndexDataStartOffset;
  sVar4 = GetDynamicBufferOffset
                    (this,(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pIndexBuffer.
                          m_pObject,true);
  if ((this->m_CommandBuffer).m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    FormatString<char[26],char[32]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])in_RCX);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"BindIndexBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x1cf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  VVar5 = sVar4 + UVar1;
  if ((((this->m_CommandBuffer).m_State.IndexBuffer != pVVar3) ||
      ((this->m_CommandBuffer).m_State.IndexBufferOffset != VVar5)) ||
     ((this->m_CommandBuffer).m_State.IndexType != VVar2)) {
    (*vkCmdBindIndexBuffer)((this->m_CommandBuffer).m_VkCmdBuffer,pVVar3,VVar5,VVar2);
    (this->m_CommandBuffer).m_State.IndexBuffer = pVVar3;
    (this->m_CommandBuffer).m_State.IndexBufferOffset = VVar5;
    (this->m_CommandBuffer).m_State.IndexType = VVar2;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::PrepareForIndexedDraw(DRAW_FLAGS Flags, VALUE_TYPE IndexType)
{
    PrepareForDraw(Flags);

#ifdef DILIGENT_DEVELOPMENT
    if ((Flags & DRAW_FLAG_VERIFY_STATES) != 0)
    {
        DvpVerifyBufferState(*m_pIndexBuffer, RESOURCE_STATE_INDEX_BUFFER, "Indexed draw call (DeviceContextVkImpl::Draw)");
    }
#endif
    DEV_CHECK_ERR(IndexType == VT_UINT16 || IndexType == VT_UINT32, "Unsupported index format. Only R16_UINT and R32_UINT are allowed.");
    VkIndexType vkIndexType = TypeToVkIndexType(IndexType);
    m_CommandBuffer.BindIndexBuffer(m_pIndexBuffer->GetVkBuffer(), m_IndexDataStartOffset + GetDynamicBufferOffset(m_pIndexBuffer), vkIndexType);
}